

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_interpolation_38(void)

{
  run("superfluous in-tag whitespace should be ignored","|{{{ string }}}|","{\"string\": \"---\"}",
      (char *)0x0,"|---|");
  return;
}

Assistant:

static void
test_interpolation_38(void)
{
    run(
        "superfluous in-tag whitespace should be ignored",
        "|{{{ string }}}|",
        "{\"string\": \"---\"}",
        NULL,
        "|---|"
    );
}